

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O3

void __thiscall
soplex::
SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::add(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      *this,int i,
     number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
     *v)

{
  uint *puVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int32_t iVar10;
  int iVar11;
  cpp_dec_float<100U,_int,_void> local_78;
  
  if ((v->m_backend).fpclass != cpp_dec_float_NaN) {
    local_78.fpclass = cpp_dec_float_finite;
    local_78.prec_elem = 0x10;
    local_78.data._M_elems[0] = 0;
    local_78.data._M_elems[1] = 0;
    local_78.data._M_elems[2] = 0;
    local_78.data._M_elems[3] = 0;
    local_78.data._M_elems[4] = 0;
    local_78.data._M_elems[5] = 0;
    local_78.data._M_elems[6] = 0;
    local_78.data._M_elems[7] = 0;
    local_78.data._M_elems[8] = 0;
    local_78.data._M_elems[9] = 0;
    local_78.data._M_elems[10] = 0;
    local_78.data._M_elems[0xb] = 0;
    local_78.data._M_elems[0xc] = 0;
    local_78.data._M_elems[0xd] = 0;
    local_78.data._M_elems._56_5_ = 0;
    local_78.data._M_elems[0xf]._1_3_ = 0;
    local_78.exp = 0;
    local_78.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_78,0.0);
    iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&v->m_backend,&local_78);
    if (iVar11 == 0) {
      return;
    }
  }
  iVar11 = this->memused;
  pNVar2 = this->m_elem;
  pNVar2[iVar11].idx = i;
  uVar3 = *(undefined8 *)((v->m_backend).data._M_elems + 2);
  uVar4 = *(undefined8 *)((v->m_backend).data._M_elems + 4);
  uVar5 = *(undefined8 *)((v->m_backend).data._M_elems + 6);
  uVar6 = *(undefined8 *)((v->m_backend).data._M_elems + 8);
  uVar7 = *(undefined8 *)((v->m_backend).data._M_elems + 10);
  uVar8 = *(undefined8 *)((v->m_backend).data._M_elems + 0xc);
  uVar9 = *(undefined8 *)((v->m_backend).data._M_elems + 0xe);
  *(undefined8 *)pNVar2[iVar11].val.m_backend.data._M_elems =
       *(undefined8 *)(v->m_backend).data._M_elems;
  *(undefined8 *)(pNVar2[iVar11].val.m_backend.data._M_elems + 2) = uVar3;
  puVar1 = pNVar2[iVar11].val.m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = uVar4;
  *(undefined8 *)(puVar1 + 2) = uVar5;
  puVar1 = pNVar2[iVar11].val.m_backend.data._M_elems + 8;
  *(undefined8 *)puVar1 = uVar6;
  *(undefined8 *)(puVar1 + 2) = uVar7;
  puVar1 = pNVar2[iVar11].val.m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar1 = uVar8;
  *(undefined8 *)(puVar1 + 2) = uVar9;
  pNVar2[iVar11].val.m_backend.exp = (v->m_backend).exp;
  pNVar2[iVar11].val.m_backend.neg = (v->m_backend).neg;
  iVar10 = (v->m_backend).prec_elem;
  pNVar2[iVar11].val.m_backend.fpclass = (v->m_backend).fpclass;
  pNVar2[iVar11].val.m_backend.prec_elem = iVar10;
  this->memused = iVar11 + 1;
  return;
}

Assistant:

void add(int i, const R& v)
   {
      assert(m_elem != nullptr);
      assert(size() < max());

      if(v != 0.0)
      {
         int n = size();

         m_elem[n].idx = i;
         m_elem[n].val = v;
         set_size(n + 1);

         assert(size() <= max());
      }
   }